

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_dec_integer<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer puVar4;
  element_type *peVar5;
  undefined1 *__dest;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  undefined1 *__n;
  error_info *v;
  basic_value<toml::type_config> *v_00;
  long lVar7;
  basic_value<toml::type_config> *ctx_00;
  size_type sVar8;
  string str;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_underscore;
  string sfx;
  region reg;
  location first;
  region sfx_reg;
  result<long,_toml::error_info> val;
  source_location src;
  string local_7f8;
  undefined2 local_7d8;
  undefined6 uStack_7d6;
  size_t sStack_7d0;
  char *pcStack_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  char *local_7a0;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_718;
  undefined1 local_700 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0 [5];
  integer_format_info local_698;
  region local_658;
  location local_5e8;
  undefined1 local_5a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_590;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_580;
  undefined8 local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_4f0;
  undefined1 local_4d8 [8];
  anon_union_88_2_fd5fb55d_for_result<long,_toml::error_info>_3 local_4d0;
  error_info local_478;
  undefined1 local_420 [120];
  region_type local_3a8;
  location local_338;
  source_location local_2f0;
  source_location local_278;
  failure<toml::error_info> local_200;
  basic_value<toml::type_config> local_1a8;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  location::location(&local_5e8,loc);
  syntax::dec_int((sequence *)local_5a0,&ctx->toml_spec_);
  sequence::scan(&local_658,(sequence *)local_5a0,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_5a0 + 8));
  if (local_658.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_738,
               "toml::parse_dec_integer: invalid integer: dec_int must be like: 42, 123_456_789","")
    ;
    syntax::dec_int((sequence *)local_420,&ctx->toml_spec_);
    location::location(&local_338,loc);
    local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"");
    make_syntax_error<toml::detail::sequence>
              ((error_info *)local_5a0,&local_738,(sequence *)local_420,&local_338,&local_758);
    err<toml::error_info>(&local_88,(error_info *)local_5a0);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568 != local_558) {
      operator_delete((void *)local_568,local_558[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_580);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0._0_8_ != &local_590) {
      operator_delete((void *)local_5a0._0_8_,(ulong)(local_590._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2) {
      operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
    }
    location::~location(&local_338);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_420 + 8));
    local_7f8._M_dataplus._M_p = local_738._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_738._M_dataplus._M_p == &local_738.field_2) goto LAB_003c6c35;
  }
  else {
    puVar4 = ((local_658.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_7f8,(detail *)(puVar4 + local_658.first_),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar4 + local_658.last_),in_RCX);
    paVar1 = &local_7c0.field_2;
    pcStack_7c8 = (char *)0x0;
    local_7c0._M_string_length = 0;
    local_7c0.field_2._M_local_buf[0] = '\0';
    local_7d8 = 0x100;
    local_5a0._0_8_ = local_7f8._M_dataplus._M_p + local_7f8._M_string_length;
    if (local_7f8._M_string_length == 0) {
      lVar7 = 0;
    }
    else {
      sVar8 = 0;
      lVar7 = 0;
      do {
        lVar7 = lVar7 + (ulong)(local_7f8._M_dataplus._M_p[sVar8] == '_');
        sVar8 = sVar8 + 1;
      } while (local_7f8._M_string_length != sVar8);
    }
    sStack_7d0 = local_7f8._M_string_length - lVar7;
    local_700[0] = 0x5f;
    local_420._0_8_ = local_7f8._M_dataplus._M_p;
    local_7c0._M_dataplus._M_p = (pointer)paVar1;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
              (&local_7a0);
    if (local_7a0 != local_7f8._M_dataplus._M_p) {
      pcStack_7c8 = local_7f8._M_dataplus._M_p + (local_7f8._M_string_length - (long)local_7a0);
    }
    local_5a0[0] = 0x5f;
    _Var6 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_7f8._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_7f8._M_dataplus._M_p + local_7f8._M_string_length),
                       (_Iter_equals_val<const_char>)local_5a0);
    local_7f8._M_string_length = (long)_Var6._M_current - (long)local_7f8._M_dataplus._M_p;
    *_Var6._M_current = '\0';
    region::region((region *)local_5a0,loc);
    source_location::source_location((source_location *)local_420,(region *)local_5a0);
    region::~region((region *)local_5a0);
    source_location::source_location(&local_278,(source_location *)local_420);
    type_config::parse_int((result<long,_toml::error_info> *)local_4d8,&local_7f8,&local_278,'\n');
    source_location::~source_location(&local_278);
    if (local_4d8[0] == false) {
      (loc->source_).
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_5e8.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(loc->source_).
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_5e8.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &loc->source_name_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_5e8.source_name_);
      loc->column_number_ = local_5e8.column_number_;
      loc->location_ = CONCAT44(local_5e8.location_._4_4_,(undefined4)local_5e8.location_);
      loc->line_number_ = CONCAT44(local_5e8.line_number_._4_4_,(undefined4)local_5e8.line_number_);
      err<toml::error_info_const&>(&local_200,(toml *)(local_4d8 + 8),v);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_200);
      failure<toml::error_info>::~failure(&local_200);
    }
    else {
      if ((ctx->toml_spec_).ext_num_suffix == true) {
        peVar5 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        last._M_current =
             (peVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
        if ((loc->location_ <
             (ulong)((long)(peVar5->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)last._M_current)) &&
           (last._M_current[loc->location_] == '_')) {
          syntax::num_suffix((sequence *)local_700,&ctx->toml_spec_);
          sequence::scan((region *)local_5a0,(sequence *)local_700,loc);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)(local_700 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a0._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (loc->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = local_5e8.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &(loc->source_).
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_5e8.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &loc->source_name_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_5e8.source_name_);
            loc->column_number_ = local_5e8.column_number_;
            *(undefined4 *)&loc->location_ = (undefined4)local_5e8.location_;
            *(undefined4 *)((long)&loc->location_ + 4) = local_5e8.location_._4_4_;
            *(undefined4 *)&loc->line_number_ = (undefined4)local_5e8.line_number_;
            *(undefined4 *)((long)&loc->line_number_ + 4) = local_5e8.line_number_._4_4_;
            local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_778,
                       "toml::parse_dec_integer: invalid suffix: should be `_ non-digit-graph (graph | _graph)`"
                       ,"");
            region::region((region *)local_700,loc);
            source_location::source_location(&local_2f0,(region *)local_700);
            local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"here","");
            make_error_info<>(&local_478,&local_778,&local_2f0,&local_798);
            err<toml::error_info>(&local_e0,&local_478);
            __return_storage_ptr__->is_ok_ = false;
            failure<toml::error_info>::failure
                      ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                       &local_e0);
            failure<toml::error_info>::~failure(&local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_478.suffix_._M_dataplus._M_p != &local_478.suffix_.field_2) {
              operator_delete(local_478.suffix_._M_dataplus._M_p,
                              local_478.suffix_.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&local_478.locations_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_478.title_._M_dataplus._M_p != &local_478.title_.field_2) {
              operator_delete(local_478.title_._M_dataplus._M_p,
                              local_478.title_.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_798._M_dataplus._M_p != &local_798.field_2) {
              operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1
                             );
            }
            source_location::~source_location(&local_2f0);
            region::~region((region *)local_700);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_778._M_dataplus._M_p != &local_778.field_2) {
              operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1
                             );
            }
            region::~region((region *)local_5a0);
            goto LAB_003c6bdf;
          }
          make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((string *)local_700,(detail *)(*(_func_int **)local_5a0._0_8_ + local_568),
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(*(_func_int **)local_5a0._0_8_ + local_558[0]._8_8_),last);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_700._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) {
            __dest = (undefined1 *)CONCAT71(local_700._1_7_,local_700[0]);
            __n = (undefined1 *)
                  ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_700._8_8_ + -0x10)
                          )->_M_weak_count + 3);
            if (__n == (undefined1 *)0x1) {
              *__dest = __dest[1];
            }
            else {
              memmove(__dest,__dest + 1,(size_t)__n);
            }
          }
          *(undefined1 *)(CONCAT71(local_700._1_7_,local_700[0]) + -1 + local_700._8_8_) = 0;
          local_700._8_8_ =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_700._8_8_ + -0x10))->
                       _M_weak_count + 3);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign(&local_7c0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_700._1_7_,local_700[0]) != local_6f0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_700._1_7_,local_700[0]),
                            (ulong)(local_6f0[0]._M_allocated_capacity + 1));
          }
          region::~region((region *)local_5a0);
        }
      }
      local_698._2_6_ = uStack_7d6;
      local_698._0_2_ = local_7d8;
      paVar2 = &local_698.suffix.field_2;
      local_698.width = sStack_7d0;
      local_698.spacer = (size_t)pcStack_7c8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c0._M_dataplus._M_p == paVar1) {
        local_698.suffix.field_2._8_8_ = local_7c0.field_2._8_8_;
        local_698.suffix._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_698.suffix._M_dataplus._M_p = local_7c0._M_dataplus._M_p;
      }
      local_698.suffix.field_2._M_allocated_capacity._1_7_ =
           local_7c0.field_2._M_allocated_capacity._1_7_;
      local_698.suffix.field_2._M_local_buf[0] = local_7c0.field_2._M_local_buf[0];
      local_698.suffix._M_string_length = local_7c0._M_string_length;
      local_7c0._M_string_length = 0;
      local_7c0.field_2._M_local_buf[0] = '\0';
      local_718.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_718.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_718.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar3 = &local_658.source_name_.field_2;
      local_3a8.source_name_._M_dataplus._M_p = (pointer)&local_3a8.source_name_.field_2;
      local_3a8.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_658.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_3a8.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           local_658.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_658.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_658.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_658.source_name_._M_dataplus._M_p == paVar3) {
        local_3a8.source_name_.field_2._8_8_ = local_658.source_name_.field_2._8_8_;
      }
      else {
        local_3a8.source_name_._M_dataplus._M_p = local_658.source_name_._M_dataplus._M_p;
      }
      local_3a8.source_name_._M_string_length = local_658.source_name_._M_string_length;
      local_658.source_name_._M_string_length = 0;
      local_658.source_name_.field_2._M_local_buf[0] = '\0';
      local_3a8.length_ = local_658.length_;
      local_3a8.first_ = local_658.first_;
      local_3a8.first_line_ = local_658.first_line_;
      local_3a8.first_column_ = local_658.first_column_;
      local_3a8.last_ = local_658.last_;
      local_3a8.last_line_ = local_658.last_line_;
      local_3a8.last_column_ = local_658.last_column_;
      local_7c0._M_dataplus._M_p = (pointer)paVar1;
      local_658.source_name_._M_dataplus._M_p = (pointer)paVar3;
      basic_value<toml::type_config>::basic_value
                ((basic_value<toml::type_config> *)local_5a0,(integer_type)local_4d0.succ_.value,
                 &local_698,&local_718,&local_3a8);
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)&local_1a8,(toml *)local_5a0,v_00
                );
      __return_storage_ptr__->is_ok_ = true;
      ctx_00 = &local_1a8;
      basic_value<toml::type_config>::basic_value
                (&(__return_storage_ptr__->field_1).succ_.value,&local_1a8);
      basic_value<toml::type_config>::cleanup(&local_1a8,(EVP_PKEY_CTX *)ctx_00);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1a8.comments_);
      region::~region(&local_1a8.region_);
      basic_value<toml::type_config>::cleanup
                ((basic_value<toml::type_config> *)local_5a0,(EVP_PKEY_CTX *)ctx_00);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_4f0);
      region::~region((region *)local_558);
      region::~region(&local_3a8);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_718);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698.suffix._M_dataplus._M_p != paVar2) {
        operator_delete(local_698.suffix._M_dataplus._M_p,
                        local_698.suffix.field_2._M_allocated_capacity + 1);
      }
    }
LAB_003c6bdf:
    if (local_4d8[0] == false) {
      failure<toml::error_info>::~failure((failure<toml::error_info> *)(local_4d8 + 8));
    }
    source_location::~source_location((source_location *)local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_7c0._M_dataplus._M_p,
                      CONCAT71(local_7c0.field_2._M_allocated_capacity._1_7_,
                               local_7c0.field_2._M_local_buf[0]) + 1);
    }
    local_738.field_2._M_allocated_capacity = local_7f8.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f8._M_dataplus._M_p == &local_7f8.field_2) goto LAB_003c6c35;
  }
  operator_delete(local_7f8._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
LAB_003c6c35:
  region::~region(&local_658);
  location::~location(&local_5e8);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_dec_integer(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::dec_int(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_dec_integer: "
            "invalid integer: dec_int must be like: 42, 123_456_789",
            syntax::dec_int(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value
    auto str = reg.as_string();

    integer_format_info fmt;
    fmt.fmt = integer_format::dec;
    fmt.width = str.size() - static_cast<std::size_t>(std::count(str.begin(), str.end(), '_'));

    const auto first_underscore = std::find(str.rbegin(), str.rend(), '_');
    if(first_underscore != str.rend())
    {
        fmt.spacer = static_cast<std::size_t>(std::distance(str.rbegin(), first_underscore));
    }

    // remove all `_` before calling TC::parse_int
    str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

    auto src = source_location(region(loc));
    const auto val = TC::parse_int(str, src, 10);
    if(val.is_err())
    {
        loc = first;
        return err(val.as_err());
    }

    // ----------------------------------------------------------------------
    // parse suffix (extension)

    if(spec.ext_num_suffix && loc.current() == '_')
    {
        const auto sfx_reg = syntax::num_suffix(spec).scan(loc);
        if( ! sfx_reg.is_ok())
        {
            loc = first;
            return err(make_error_info("toml::parse_dec_integer: "
                "invalid suffix: should be `_ non-digit-graph (graph | _graph)`",
                source_location(region(loc)), "here"));
        }
        auto sfx = sfx_reg.as_string();
        assert( ! sfx.empty() && sfx.front() == '_');
        sfx.erase(sfx.begin()); // remove the first `_`

        fmt.suffix = sfx;
    }

    return ok(basic_value<TC>(val.as_ok(), std::move(fmt), {}, std::move(reg)));
}